

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_ge_test(secp256k1_ge *ge)

{
  int iVar1;
  uint64_t uVar2;
  secp256k1_fe fe;
  secp256k1_fe local_40;
  
  do {
    testutil_random_fe_test(&local_40);
    uVar2 = testrand64();
    iVar1 = secp256k1_ge_set_xo_var(ge,&local_40,(uint)(uVar2 >> 0x3f));
  } while (iVar1 == 0);
  secp256k1_fe_normalize(&ge->y);
  ge->infinity = 0;
  return;
}

Assistant:

static void testutil_random_ge_test(secp256k1_ge *ge) {
    secp256k1_fe fe;
    do {
        testutil_random_fe_test(&fe);
        if (secp256k1_ge_set_xo_var(ge, &fe, testrand_bits(1))) {
            secp256k1_fe_normalize(&ge->y);
            break;
        }
    } while(1);
    ge->infinity = 0;
}